

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O2

void __thiscall write_wm_slot::operator()(write_wm_slot *this,wm_slot *slot,xr_writer *w)

{
  undefined4 local_1c;
  
  local_1c = (undefined4)
             (((long)(slot->wallmarks).
                     super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl
                     .super__Vector_impl_data._M_finish -
              (long)(slot->wallmarks).
                    super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x28);
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xray_re::xr_writer::w_sz(w,&slot->shader);
  xray_re::xr_writer::w_sz(w,&slot->texture);
  xray_re::xr_writer::
  w_seq<std::vector<xray_re::wm_data,std::allocator<xray_re::wm_data>>,write_wm_data>
            (w,&slot->wallmarks);
  return;
}

Assistant:

void operator()(const wm_slot* slot, xr_writer& w) const {
	w.w_size_u32(slot->wallmarks.size());
	w.w_sz(slot->shader);
	w.w_sz(slot->texture);
	w.w_seq(slot->wallmarks, write_wm_data());
}